

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlSubstitutionItem::DebugXmlRhs
          (GdlSubstitutionItem *this,GrcManager *pcman,ofstream *strmOut,string *param_4)

{
  int iVar1;
  ostream *poVar2;
  size_type_conflict sVar3;
  reference ppGVar4;
  ostream *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  GrcSymbolTableEntry *in_stack_00000018;
  int iexp;
  int local_50;
  string local_40 [40];
  ostream *local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  poVar2 = std::operator<<(in_RDX,"          <rhsSlot className=\"");
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(in_stack_00000018);
  std::operator<<(poVar2,local_40);
  std::__cxx11::string::~string(local_40);
  if (in_RDI[0x14] != 0) {
    poVar2 = std::operator<<(local_18,"\" selectorIndex=\"");
    iVar1 = GdlSlotRefExpression::SlotNumber((GdlSlotRefExpression *)in_RDI[0x14]);
    std::ostream::operator<<(poVar2,iVar1);
  }
  sVar3 = std::vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>::size
                    ((vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_> *)
                     (in_RDI + 0x15));
  if (sVar3 != 0) {
    std::operator<<(local_18,"\" associations=\"");
    local_50 = 0;
    while( true ) {
      sVar3 = std::vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>::size
                        ((vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_> *)
                         (in_RDI + 0x15));
      poVar2 = local_18;
      if ((int)sVar3 + -1 <= local_50) break;
      ppGVar4 = std::vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>::
                operator[]((vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>
                            *)(in_RDI + 0x15),(long)local_50);
      iVar1 = GdlSlotRefExpression::SlotNumber(*ppGVar4);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      std::operator<<(poVar2," ");
      local_50 = local_50 + 1;
    }
    ppGVar4 = std::vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_>::
              operator[]((vector<GdlSlotRefExpression_*,_std::allocator<GdlSlotRefExpression_*>_> *)
                         (in_RDI + 0x15),(long)local_50);
    iVar1 = GdlSlotRefExpression::SlotNumber(*ppGVar4);
    std::ostream::operator<<(poVar2,iVar1);
  }
  sVar3 = std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::size
                    ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                     (in_RDI + 0xf));
  if (sVar3 != 0) {
    std::operator<<(local_18,"\" assignmentGdl=\"");
    (**(code **)(*in_RDI + 0x138))(in_RDI,local_10,0,0,local_18,1);
  }
  poVar2 = std::operator<<(local_18,"\" slotIndex=\"");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)in_RDI[6] + 1);
  std::operator<<(poVar2,"\" />\n");
  return;
}

Assistant:

void GdlSubstitutionItem::DebugXmlRhs(GrcManager * pcman, std::ofstream & strmOut,
	std::string /*staPathToCur*/)
{
	strmOut << "          <rhsSlot className=\"" << m_psymOutput->FullAbbrev();
	
	if (m_pexpSelector)
		strmOut << "\" selectorIndex=\"" << m_pexpSelector->SlotNumber();

	if (m_vpexpAssocs.size() > 0)
	{
		strmOut << "\" associations=\"";
		int iexp;
		for (iexp = 0; iexp < signed(m_vpexpAssocs.size()) - 1; iexp++)
			strmOut << m_vpexpAssocs[iexp]->SlotNumber() << " ";
		strmOut << m_vpexpAssocs[iexp]->SlotNumber();
	}

	if (m_vpavs.size() > 0)
	{
		strmOut << "\" assignmentGdl=\"";
		AttrSetterPrettyPrint(pcman, NULL, 0, strmOut, true);	// NULL and 0 are bogus but not used
	}
	strmOut << "\" slotIndex=\"" << m_iritContextPos + 1 << "\" />\n";

}